

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readInputImage.cpp
# Opt level: O3

void readInputImage(char *inFileName,float padTop,float padBottom,Envmap overrideType,bool verbose,
                   EnvmapImage *image,Header *header,RgbaChannels *channels)

{
  char cVar1;
  int iVar2;
  RgbaChannels RVar3;
  char *pcVar4;
  long *plVar5;
  ostream *poVar6;
  int *piVar7;
  Header *pHVar8;
  Array2D<Imf_3_4::Rgba> *pAVar9;
  size_t sVar10;
  Envmap *pEVar11;
  InputExc *pIVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  Rgba *pRVar20;
  float fVar21;
  int iVar22;
  uint uVar23;
  string name;
  string name_1;
  RgbaInputFile in;
  stringstream _iex_throw_s;
  Box2i imageDw;
  long *local_278;
  long local_270;
  long local_268 [2];
  float local_258;
  long *local_240;
  long local_238;
  long local_230 [2];
  long local_220;
  Rgba local_218 [8];
  long local_1d8;
  ulong local_1d0;
  Box2i local_1c8;
  long local_1b8 [47];
  Box2i local_40;
  
  local_258 = padTop;
  pcVar4 = strchr(inFileName,0x25);
  if (pcVar4 == (char *)0x0) {
    local_278 = (long *)CONCAT44(local_278._4_4_,overrideType);
    iVar2 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_218,inFileName,iVar2);
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading file ",0xd);
      if (inFileName == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10e190);
      }
      else {
        sVar10 = strlen(inFileName);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,inFileName,sVar10);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
    }
    pHVar8 = (Header *)Imf_3_4::RgbaInputFile::header();
    Imf_3_4::Header::operator=(header,pHVar8);
    RVar3 = Imf_3_4::RgbaInputFile::channels();
    *channels = RVar3;
    if (overrideType < NUM_ENVMAPTYPES) {
      Imf_3_4::addEnvmap(header,(Envmap *)&local_278);
    }
    else {
      pHVar8 = (Header *)Imf_3_4::RgbaInputFile::header();
      cVar1 = Imf_3_4::hasEnvmap(pHVar8);
      overrideType = ENVMAP_LATLONG;
      if (cVar1 != '\0') {
        pHVar8 = (Header *)Imf_3_4::RgbaInputFile::header();
        pEVar11 = (Envmap *)Imf_3_4::envmap(pHVar8);
        overrideType = *pEVar11;
        if (ENVMAP_CUBE < overrideType) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,"unknown envmap type ",0x14);
          std::ostream::operator<<((ostream *)local_1b8,*pEVar11);
          pIVar12 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::InputExc::InputExc(pIVar12,(stringstream *)&local_1c8);
          __cxa_throw(pIVar12,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
        }
      }
    }
    piVar7 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    iVar15 = piVar7[2];
    iVar17 = *piVar7;
    iVar19 = piVar7[3] - piVar7[1];
    iVar2 = iVar19 + 1;
    iVar22 = 0;
    uVar23 = 0;
    if (overrideType == ENVMAP_LATLONG) {
      fVar21 = (float)iVar2;
      iVar22 = (int)(fVar21 * padBottom + 0.5);
      uVar23 = (uint)(fVar21 * local_258 + 0.5);
    }
    local_1c8.min.y = piVar7[1] - uVar23;
    local_1c8.max.y = piVar7[3] + iVar22;
    local_258 = (float)iVar22;
    local_1c8.min.x = iVar17;
    local_1c8.max.x = iVar15;
    EnvmapImage::resize(image,overrideType,&local_1c8);
    pAVar9 = EnvmapImage::pixels(image);
    iVar15 = iVar15 - iVar17;
    Imf_3_4::RgbaInputFile::setFrameBuffer
              (local_218,
               (ulong)(pAVar9->_data +
                      (-(long)local_1c8.min.y * pAVar9->_sizeY - (long)local_1c8.min.x)),1);
    Imf_3_4::RgbaInputFile::readPixels((int)local_218,piVar7[1]);
    if (0 < (int)uVar23) {
      lVar16 = 0;
      uVar14 = 0;
      do {
        if (-1 < iVar15) {
          uVar18 = 0;
          do {
            *(Rgba *)((long)&pAVar9->_data[uVar18].r._h + lVar16 * pAVar9->_sizeY) =
                 pAVar9->_data[pAVar9->_sizeY * (ulong)uVar23 + uVar18];
            uVar18 = uVar18 + 1;
          } while (iVar15 + 1 != uVar18);
        }
        uVar14 = uVar14 + 1;
        lVar16 = lVar16 + 8;
      } while (uVar14 != uVar23);
    }
    if (0 < (int)local_258) {
      iVar2 = iVar2 + uVar23;
      lVar13 = (long)iVar2;
      lVar16 = lVar13 * 8;
      do {
        if (-1 < iVar15) {
          uVar14 = 0;
          do {
            *(Rgba *)((long)&pAVar9->_data[uVar14].r._h + lVar16 * pAVar9->_sizeY) =
                 pAVar9->_data[pAVar9->_sizeY * (long)(int)(iVar19 + uVar23) + uVar14];
            uVar14 = uVar14 + 1;
          } while (iVar15 + 1 != uVar14);
        }
        lVar13 = lVar13 + 1;
        lVar16 = lVar16 + 8;
      } while (lVar13 < (int)local_258 + iVar2);
    }
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_218);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,inFileName,(allocator<char> *)local_218);
    local_1d0 = (long)pcVar4 - (long)inFileName;
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1c8,local_1d0,(char *)0x1,0x10a248)
    ;
    local_278 = local_268;
    std::__cxx11::string::_M_construct<char*>((string *)&local_278,*plVar5,plVar5[1] + *plVar5);
    if ((long *)CONCAT44(local_1c8.min.y,local_1c8.min.x) != local_1b8) {
      operator_delete((long *)CONCAT44(local_1c8.min.y,local_1c8.min.x),local_1b8[0] + 1);
    }
    plVar5 = local_278;
    iVar2 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_218,(char *)plVar5,iVar2);
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"reading cube face size from file ",0x21);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_278,local_270);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    piVar7 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    local_220 = (long)*piVar7;
    iVar2 = piVar7[1];
    uVar23 = piVar7[2];
    local_258 = (float)piVar7[3];
    iVar17 = uVar23 - *piVar7;
    iVar15 = (int)local_258 - iVar2;
    if (iVar17 != iVar15) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,"Cube face image ",0x10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1b8,(char *)local_278,local_270);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," is not square.",0xf);
      pIVar12 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::InputExc::InputExc(pIVar12,(stringstream *)&local_1c8);
      __cxa_throw(pIVar12,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
    }
    pHVar8 = (Header *)Imf_3_4::RgbaInputFile::header();
    Imf_3_4::Header::operator=(header,pHVar8);
    RVar3 = Imf_3_4::RgbaInputFile::channels();
    *channels = RVar3;
    local_1c8.min.x = 1;
    Imf_3_4::addEnvmap(header,(Envmap *)&local_1c8);
    iVar15 = iVar15 + 1;
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_218);
    local_40.max.y = iVar15 * 6 + -1;
    local_40.min.x = 0;
    local_40.min.y = 0;
    local_40.max.x = iVar17;
    EnvmapImage::resize(image,ENVMAP_CUBE,&local_40);
    pAVar9 = EnvmapImage::pixels(image);
    pRVar20 = pAVar9->_data + (((int)~uVar23 + local_220) * (long)iVar2 - local_220);
    local_1d8 = (long)(iVar15 * (iVar17 + 1)) << 3;
    lVar16 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,inFileName,(allocator<char> *)local_218);
      pcVar4 = *(char **)((long)&(anonymous_namespace)::
                                 readSixImages(char_const*,bool,EnvmapImage&,Imf_3_4::Header&,Imf_3_4::RgbaChannels&)
                                 ::faceNames + lVar16);
      strlen(pcVar4);
      plVar5 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_1c8,local_1d0,(char *)0x1,(ulong)pcVar4);
      local_240 = local_230;
      std::__cxx11::string::_M_construct<char*>((string *)&local_240,*plVar5,plVar5[1] + *plVar5);
      if ((long *)CONCAT44(local_1c8.min.y,local_1c8.min.x) != local_1b8) {
        operator_delete((long *)CONCAT44(local_1c8.min.y,local_1c8.min.x),local_1b8[0] + 1);
      }
      plVar5 = local_240;
      iVar15 = Imf_3_4::globalThreadCount();
      Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_218,(char *)plVar5,iVar15);
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"reading file ",0xd);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_240,local_238);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
      piVar7 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
      if ((((*piVar7 != (int)local_220) || (piVar7[1] != iVar2)) || (piVar7[2] != uVar23)) ||
         ((float)piVar7[3] != local_258)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b8,"The data window of cube face ",0x1d);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1b8,(char *)local_240,local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6," differs from the data window of other cube faces.",0x32);
        pIVar12 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::InputExc::InputExc(pIVar12,(stringstream *)&local_1c8);
        __cxa_throw(pIVar12,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
      }
      Imf_3_4::RgbaInputFile::setFrameBuffer(local_218,(ulong)pRVar20,1);
      Imf_3_4::RgbaInputFile::readPixels((int)local_218,iVar2);
      Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_218);
      if (local_240 != local_230) {
        operator_delete(local_240,local_230[0] + 1);
      }
      lVar16 = lVar16 + 8;
      pRVar20 = (Rgba *)((long)&(pRVar20->r)._h + local_1d8);
    } while (lVar16 != 0x30);
    if (local_278 != local_268) {
      operator_delete(local_278,local_268[0] + 1);
    }
  }
  return;
}

Assistant:

void
readInputImage (
    const char    inFileName[],
    float         padTop,
    float         padBottom,
    Envmap        overrideType,
    bool          verbose,
    EnvmapImage&  image,
    Header&       header,
    RgbaChannels& channels)
{
    if (strchr (inFileName, '%'))
    {
        readSixImages (inFileName, verbose, image, header, channels);
    }
    else
    {
        readSingleImage (
            inFileName,
            padTop,
            padBottom,
            overrideType,
            verbose,
            image,
            header,
            channels);
    }
}